

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O1

UStringTrieResult __thiscall icu_63::BytesTrie::next(BytesTrie *this,char *s,int32_t sLength)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  UStringTrieResult UVar4;
  byte *pbVar5;
  char cVar6;
  uint length;
  long lVar7;
  UStringTrieResult unaff_EBX;
  int iVar8;
  byte *pbVar9;
  int iVar10;
  char *pcVar11;
  uint inByte;
  
  if (sLength < 0) {
    if (*s == '\0') goto LAB_00310149;
  }
  else if (sLength == 0) {
LAB_00310149:
    if (this->pos_ == (byte *)0x0) {
      return USTRINGTRIE_NO_MATCH;
    }
    if (this->remainingMatchLength_ < 0) {
      UVar4 = (UStringTrieResult)*this->pos_;
      if (0x1f < UVar4) {
        return UVar4 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      }
      return USTRINGTRIE_NO_VALUE;
    }
    return USTRINGTRIE_NO_VALUE;
  }
  pbVar5 = this->pos_;
  if (pbVar5 == (byte *)0x0) {
    return USTRINGTRIE_NO_MATCH;
  }
  iVar8 = this->remainingMatchLength_;
  do {
    if (sLength < 0) {
      cVar6 = *s;
      pcVar11 = s + 1;
      if (cVar6 != '\0') {
        iVar3 = -1;
        if (iVar8 < -1) {
          iVar3 = iVar8;
        }
        do {
          inByte = (uint)cVar6;
          if (iVar8 < 0) goto LAB_0030ffc6;
          if (inByte != *pbVar5) {
            this->pos_ = (uint8_t *)0x0;
            goto LAB_00310132;
          }
          pbVar5 = pbVar5 + 1;
          iVar8 = iVar8 + -1;
          cVar6 = *pcVar11;
          pcVar11 = pcVar11 + 1;
        } while (cVar6 != '\0');
      }
      this->remainingMatchLength_ = iVar8;
      this->pos_ = pbVar5;
      unaff_EBX = USTRINGTRIE_NO_VALUE;
      if ((iVar8 < 0) && (UVar4 = (UStringTrieResult)*pbVar5, 0x1f < UVar4)) goto LAB_0030ff99;
      bVar2 = false;
    }
    else {
      pbVar9 = pbVar5;
      pcVar11 = s;
      iVar10 = iVar8;
      if (sLength != 0) {
        iVar3 = -1;
        if (iVar8 < -1) {
          iVar3 = iVar8;
        }
        pbVar9 = pbVar5 + (ulong)(sLength - 1) + 1;
        iVar10 = iVar8 - sLength;
        pcVar11 = s + (ulong)(sLength - 1) + 1;
        lVar7 = 0;
        do {
          inByte = (uint)s[lVar7];
          if (iVar8 < 0) {
            pcVar11 = s + lVar7 + 1;
            sLength = ~(uint)lVar7 + sLength;
            pbVar5 = pbVar5 + lVar7;
LAB_0030ffc6:
            iVar8 = iVar3;
            this->remainingMatchLength_ = iVar8;
            pbVar9 = pbVar5;
            do {
              pbVar5 = pbVar9 + 1;
              bVar1 = *pbVar9;
              length = (uint)bVar1;
              if (bVar1 < 0x10) {
                UVar4 = branchNext(this,pbVar5,length,inByte);
                iVar3 = 1;
                if (UVar4 == USTRINGTRIE_NO_MATCH) {
                  bVar2 = false;
                  unaff_EBX = USTRINGTRIE_NO_MATCH;
                  goto LAB_003100f1;
                }
                if (sLength < 0) {
                  cVar6 = *pcVar11;
                  if (cVar6 == '\0') {
                    inByte = 0;
                    pcVar11 = pcVar11 + 1;
                    goto LAB_003100d7;
                  }
                }
                else {
                  if (sLength == 0) {
                    sLength = 0;
LAB_003100d7:
                    bVar2 = false;
                    unaff_EBX = UVar4;
                    goto LAB_003100f1;
                  }
                  cVar6 = *pcVar11;
                  sLength = sLength + -1;
                }
                pcVar11 = pcVar11 + 1;
                inByte = (uint)cVar6;
                if (UVar4 == USTRINGTRIE_FINAL_VALUE) {
                  this->pos_ = (uint8_t *)0x0;
                  goto LAB_003100b2;
                }
                pbVar5 = this->pos_;
                bVar2 = true;
                iVar3 = 0;
              }
              else if (bVar1 < 0x20) {
                if (inByte == *pbVar5) {
                  pbVar5 = pbVar9 + 2;
                  iVar8 = length - 0x11;
                  bVar2 = false;
                  iVar3 = 8;
                }
                else {
                  iVar8 = length - 0x10;
                  this->pos_ = (uint8_t *)0x0;
LAB_003100b2:
                  bVar2 = false;
                  unaff_EBX = USTRINGTRIE_NO_MATCH;
                  iVar3 = 1;
                }
              }
              else {
                if ((bVar1 & 1) != 0) {
                  this->pos_ = (uint8_t *)0x0;
                  goto LAB_003100b2;
                }
                iVar3 = 0;
                bVar2 = true;
                if (0xa1 < bVar1) {
                  if (bVar1 < 0xd8) {
                    pbVar5 = pbVar9 + 2;
                    iVar3 = 0;
                  }
                  else if (bVar1 < 0xfc) {
                    pbVar5 = pbVar9 + 3;
                    iVar3 = 0;
                  }
                  else {
                    pbVar5 = pbVar9 + (ulong)((bVar1 >> 1 & 1) != 0) + 4;
                  }
                }
              }
LAB_003100f1:
              pbVar9 = pbVar5;
            } while (iVar3 == 0);
            if (iVar3 == 8) {
              bVar2 = true;
            }
            goto LAB_00310134;
          }
          if (inByte != pbVar5[lVar7]) {
            this->pos_ = (uint8_t *)0x0;
            pcVar11 = s + lVar7 + 1;
            sLength = ~(uint)lVar7 + sLength;
            pbVar5 = pbVar5 + lVar7;
LAB_00310132:
            bVar2 = false;
            unaff_EBX = USTRINGTRIE_NO_MATCH;
            goto LAB_00310134;
          }
          iVar8 = iVar8 + -1;
          lVar7 = lVar7 + 1;
        } while (sLength != (int)lVar7);
      }
      this->remainingMatchLength_ = iVar10;
      this->pos_ = pbVar9;
      unaff_EBX = USTRINGTRIE_NO_VALUE;
      pbVar5 = pbVar9;
      iVar8 = iVar10;
      if ((iVar10 < 0) && (UVar4 = (UStringTrieResult)*pbVar9, 0x1f < UVar4)) {
        sLength = 0;
LAB_0030ff99:
        unaff_EBX = UVar4 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
        bVar2 = false;
      }
      else {
        bVar2 = false;
        sLength = 0;
      }
    }
LAB_00310134:
    s = pcVar11;
    if (!bVar2) {
      return unaff_EBX;
    }
  } while( true );
}

Assistant:

UStringTrieResult
BytesTrie::next(const char *s, int32_t sLength) {
    if(sLength<0 ? *s==0 : sLength==0) {
        // Empty input.
        return current();
    }
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    for(;;) {
        // Fetch the next input byte, if there is one.
        // Continue a linear-match node without rechecking sLength<0.
        int32_t inByte;
        if(sLength<0) {
            for(;;) {
                if((inByte=*s++)==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        } else {
            for(;;) {
                if(sLength==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                inByte=*s++;
                --sLength;
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        }
        for(;;) {
            int32_t node=*pos++;
            if(node<kMinLinearMatch) {
                UStringTrieResult result=branchNext(pos, node, inByte);
                if(result==USTRINGTRIE_NO_MATCH) {
                    return USTRINGTRIE_NO_MATCH;
                }
                // Fetch the next input byte, if there is one.
                if(sLength<0) {
                    if((inByte=*s++)==0) {
                        return result;
                    }
                } else {
                    if(sLength==0) {
                        return result;
                    }
                    inByte=*s++;
                    --sLength;
                }
                if(result==USTRINGTRIE_FINAL_VALUE) {
                    // No further matching bytes.
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                pos=pos_;  // branchNext() advanced pos and wrote it to pos_ .
            } else if(node<kMinValueLead) {
                // Match length+1 bytes.
                length=node-kMinLinearMatch;  // Actual match length minus 1.
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
                break;
            } else if(node&kValueIsFinal) {
                // No further matching bytes.
                stop();
                return USTRINGTRIE_NO_MATCH;
            } else {
                // Skip intermediate value.
                pos=skipValue(pos, node);
                // The next node must not also be a value node.
                U_ASSERT(*pos<kMinValueLead);
            }
        }
    }
}